

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O1

void TTD::NSSnapValues::EmitSlotArrayInfo
               (SlotArrayInfo *slotInfo,FileWriter *writer,Separator separator)

{
  undefined7 in_register_00000011;
  TTD_PTR_ID val;
  Key key;
  ulong uVar1;
  
  (*writer->_vptr_FileWriter[6])(writer,CONCAT71(in_register_00000011,separator) & 0xffffffff);
  (*writer->_vptr_FileWriter[8])(writer,1);
  FileWriter::WriteAddr(writer,slotId,slotInfo->SlotId,BigSpaceSeparator);
  FileWriter::WriteLogTag(writer,ctxTag,slotInfo->ScriptContextLogId,CommaSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,0x4c,(ulong)slotInfo->isFunctionBodyMetaData,1);
  if (slotInfo->isFunctionBodyMetaData == true) {
    val = slotInfo->OptFunctionBodyId;
    key = functionBodyId;
  }
  else {
    (*writer->_vptr_FileWriter[0xc])
              (writer,0x19,(ulong)(slotInfo->OptWellKnownDbgScope != (TTD_WELLKNOWN_TOKEN)0x0),1);
    if (slotInfo->OptWellKnownDbgScope != (TTD_WELLKNOWN_TOKEN)0x0) {
      FileWriter::WriteWellKnownToken
                (writer,wellKnownToken,slotInfo->OptWellKnownDbgScope,CommaSeparator);
      goto LAB_0093c1a2;
    }
    val = slotInfo->OptDebugScopeId;
    key = debuggerScopeId;
  }
  FileWriter::WriteAddr(writer,key,val,CommaSeparator);
LAB_0093c1a2:
  FileWriter::WriteLengthValue(writer,slotInfo->SlotCount,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaAndBigSpaceSeparator);
  (*writer->_vptr_FileWriter[8])(writer,1);
  if (slotInfo->SlotCount != 0) {
    uVar1 = 0;
    do {
      (*writer->_vptr_FileWriter[6])(writer,(ulong)(3 - (uVar1 == 0)));
      FileWriter::WriteUInt32(writer,pid,slotInfo->PIDArray[uVar1],NoSeparator);
      (*writer->_vptr_FileWriter[3])(writer,3,1);
      EmitTTDVar(slotInfo->Slots[uVar1],writer,NoSeparator);
      (*writer->_vptr_FileWriter[7])(writer,0);
      uVar1 = uVar1 + 1;
    } while (uVar1 < slotInfo->SlotCount);
  }
  (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
  (*writer->_vptr_FileWriter[5])(writer,2);
  (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
  (*writer->_vptr_FileWriter[7])(writer,2);
  return;
}

Assistant:

void EmitSlotArrayInfo(const SlotArrayInfo* slotInfo, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);
            writer->AdjustIndent(1);

            writer->WriteAddr(NSTokens::Key::slotId, slotInfo->SlotId, NSTokens::Separator::BigSpaceSeparator);
            writer->WriteLogTag(NSTokens::Key::ctxTag, slotInfo->ScriptContextLogId, NSTokens::Separator::CommaSeparator);

            writer->WriteBool(NSTokens::Key::isFunctionMetaData, slotInfo->isFunctionBodyMetaData, NSTokens::Separator::CommaSeparator);
            if(slotInfo->isFunctionBodyMetaData)
            {
                writer->WriteAddr(NSTokens::Key::functionBodyId, slotInfo->OptFunctionBodyId, NSTokens::Separator::CommaSeparator);
            }
            else
            {
                writer->WriteBool(NSTokens::Key::isWellKnownToken, slotInfo->OptWellKnownDbgScope != TTD_INVALID_WELLKNOWN_TOKEN, NSTokens::Separator::CommaSeparator);
                if(slotInfo->OptWellKnownDbgScope != TTD_INVALID_WELLKNOWN_TOKEN)
                {
                    writer->WriteWellKnownToken(NSTokens::Key::wellKnownToken, slotInfo->OptWellKnownDbgScope, NSTokens::Separator::CommaSeparator);
                }
                else
                {
                    writer->WriteAddr(NSTokens::Key::debuggerScopeId, slotInfo->OptDebugScopeId, NSTokens::Separator::CommaSeparator);
                }
            }

            writer->WriteLengthValue(slotInfo->SlotCount, NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->AdjustIndent(1);
            for(uint32 i = 0; i < slotInfo->SlotCount; ++i)
            {
                writer->WriteRecordStart(i != 0 ? NSTokens::Separator::CommaAndBigSpaceSeparator : NSTokens::Separator::BigSpaceSeparator);
                writer->WriteUInt32(NSTokens::Key::pid, slotInfo->PIDArray[i], NSTokens::Separator::NoSeparator);
                writer->WriteKey(NSTokens::Key::entry, NSTokens::Separator::CommaSeparator);

                EmitTTDVar(slotInfo->Slots[i], writer, NSTokens::Separator::NoSeparator);

                writer->WriteRecordEnd();
            }
            writer->AdjustIndent(-1);
            writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);

            writer->AdjustIndent(-1);
            writer->WriteRecordEnd(NSTokens::Separator::BigSpaceSeparator);
        }